

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Function<kj::MainBuilder::Validity_()> * __thiscall
kj::_::NullableValue<kj::Function<kj::MainBuilder::Validity()>>::
emplace<kj::Function<kj::MainBuilder::Validity()>>
          (NullableValue<kj::Function<kj::MainBuilder::Validity()>> *this,
          Function<kj::MainBuilder::Validity_()> *params)

{
  Iface *pIVar1;
  
  if (*this == (NullableValue<kj::Function<kj::MainBuilder::Validity()>>)0x1) {
    *this = (NullableValue<kj::Function<kj::MainBuilder::Validity()>>)0x0;
    Own<kj::Function<kj::MainBuilder::Validity_()>::Iface,_std::nullptr_t>::dispose
              ((Own<kj::Function<kj::MainBuilder::Validity_()>::Iface,_std::nullptr_t> *)(this + 8))
    ;
  }
  pIVar1 = (params->impl).ptr;
  *(Disposer **)(this + 8) = (params->impl).disposer;
  *(Iface **)(this + 0x10) = pIVar1;
  (params->impl).ptr = (Iface *)0x0;
  *this = (NullableValue<kj::Function<kj::MainBuilder::Validity()>>)0x1;
  return (Function<kj::MainBuilder::Validity_()> *)(this + 8);
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }